

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_s256_30_256_idx(mzd_local_t *c,mzd_local_t *A,word idx)

{
  long lVar1;
  block_t *Ablock;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  auVar2 = vpbroadcastq_avx512vl();
  auVar3 = vpternlogq_avx512vl(auVar2,*(undefined1 (*) [32])A->w64,*(undefined1 (*) [32])c->w64,0x6a
                              );
  auVar2 = vpbroadcastq_avx512vl();
  auVar2 = vpand_avx2(auVar2,*(undefined1 (*) [32])A[1].w64);
  lVar1 = 0x40;
  while ((int)lVar1 != 0x3c0) {
    auVar4 = vpbroadcastq_avx512vl();
    auVar5 = vpbroadcastq_avx512vl();
    auVar4 = vpand_avx2(auVar4,*(undefined1 (*) [32])((long)A->w64 + lVar1));
    auVar5 = vpand_avx2(auVar5,*(undefined1 (*) [32])((long)A[2].w64 + lVar1));
    auVar6 = vpbroadcastq_avx512vl();
    auVar6 = vpand_avx2(auVar6,*(undefined1 (*) [32])((long)A[1].w64 + lVar1));
    auVar3 = vpternlogq_avx512vl(auVar3,auVar4,auVar5,0x96);
    auVar4 = vpbroadcastq_avx512vl();
    auVar4 = vpand_avx2(auVar4,*(undefined1 (*) [32])((long)A[3].w64 + lVar1));
    lVar1 = lVar1 + 0x80;
    auVar2 = vpternlogq_avx512vl(auVar2,auVar6,auVar4,0x96);
  }
  *(undefined1 (*) [32])c->w64 = auVar3 ^ auVar2;
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void mzd_addmul_v_s256_30_256_idx(mzd_local_t* c, mzd_local_t const* A, word idx) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2];
  cval[0] = mm256_xor_mask(mm256_load(cblock->w64), mm256_load(Ablock[0].w64),
                           mm256_compute_mask(idx, 0));
  cval[1] = mm256_and(mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
  idx >>= 2;
  Ablock += 2;

  for (unsigned int i = 28; i; i -= 4, idx >>= 4, Ablock += 4) {
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask(idx, 0));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask(idx, 2));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask(idx, 3));
  }
  mm256_store(cblock->w64, mm256_xor(cval[0], cval[1]));
}